

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall gimage::BasicImageIO::save(BasicImageIO *this,ImageFloat *image,char *name)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  allocator *__lhs;
  allocator local_79;
  string local_78 [16];
  string *in_stack_ffffffffffffff98;
  IOException *in_stack_ffffffffffffffa0;
  
  uVar1 = __cxa_allocate_exception(0x28);
  __lhs = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,(char *)in_RDX,__lhs);
  std::operator+((char *)__lhs,in_RDX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)in_RDX);
  gutil::IOException::IOException(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __cxa_throw(uVar1,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void BasicImageIO::save(const ImageFloat &image, const char *name) const
{
  throw gutil::IOException("Saving this image type is not implemented! ("+std::string(name)+")");
}